

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O0

float FromLinear709(float linear)

{
  float in_XMM0_Da;
  float fVar1;
  undefined4 local_4;
  
  if (0.0 <= in_XMM0_Da) {
    if (0.01805397 <= in_XMM0_Da) {
      if (1.0 <= in_XMM0_Da) {
        local_4 = 1.0;
      }
      else {
        fVar1 = Powf(0.0,2.696408e-39);
        local_4 = fVar1 * 1.0992968 + -0.09929682;
      }
    }
    else {
      local_4 = in_XMM0_Da * 4.5;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

static float FromLinear709(float linear) {
  if (linear < 0.f) {
    return 0.f;
  } else if (linear < 0.018053968510807f) {
    return linear * 4.5f;
  } else if (linear < 1.f) {
    return 1.09929682680944f * Powf(linear, 0.45f) - 0.09929682680944f;
  }
  return 1.f;
}